

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall
QGraphicsDropShadowEffect::setBlurRadius(QGraphicsDropShadowEffect *this,qreal blurRadius)

{
  bool bVar1;
  QGraphicsEffect *in_RDI;
  double unaff_retaddr;
  double in_stack_00000008;
  QGraphicsDropShadowEffectPrivate *d;
  qreal in_stack_ffffffffffffffd8;
  
  d_func((QGraphicsDropShadowEffect *)0x4a4ce2);
  QPixmapDropShadowFilter::blurRadius((QPixmapDropShadowFilter *)in_RDI);
  bVar1 = qFuzzyCompare(in_stack_00000008,unaff_retaddr);
  if (!bVar1) {
    QPixmapDropShadowFilter::setBlurRadius
              ((QPixmapDropShadowFilter *)in_RDI,in_stack_ffffffffffffffd8);
    QGraphicsEffect::updateBoundingRect(in_RDI);
    blurRadiusChanged((QGraphicsDropShadowEffect *)0x4a4d3c,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QGraphicsDropShadowEffect::setBlurRadius(qreal blurRadius)
{
    Q_D(QGraphicsDropShadowEffect);
    if (qFuzzyCompare(d->filter->blurRadius(), blurRadius))
        return;

    d->filter->setBlurRadius(blurRadius);
    updateBoundingRect();
    emit blurRadiusChanged(blurRadius);
}